

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::tent_dist<double>::operator()(tent_dist<double> *this,lcg64_shift *r)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = (r->S).r * (r->P).a + (r->P).b;
  uVar2 = uVar1 >> 0x11 ^ uVar1;
  uVar2 = uVar2 << 0x1f ^ uVar2;
  dVar3 = (double)(uVar2 >> 1 ^ uVar2 >> 9) * 1.0842021724855044e-19;
  (r->S).r = uVar1;
  if (0.5 <= dVar3) {
    dVar3 = 2.0 - (dVar3 + dVar3);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = 1.0 - dVar3;
  }
  else {
    dVar3 = dVar3 + dVar3;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = dVar3 + -1.0;
  }
  return dVar3 * (this->P).d_ + (this->P).m_;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformcc<result_type>(r));
    }